

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O0

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_miter
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double dx1,double dy1,double dx2,double dy2,line_join_e lj,double mlimit,
          double dbevel)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double y2_1;
  double x2_1;
  double y1;
  double x1;
  double y2;
  double x2;
  bool intersection_failed;
  bool miter_limit_exceeded;
  double lim;
  double di;
  double yi;
  double xi;
  double dbevel_local;
  double mlimit_local;
  double dStack_50;
  line_join_e lj_local;
  double dy2_local;
  double dx2_local;
  double dy1_local;
  double dx1_local;
  vertex_dist *v2_local;
  vertex_dist *v1_local;
  vertex_dist *v0_local;
  pod_bvector<agg::point_base<double>,_6U> *vc_local;
  math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this_local;
  
  yi = v1->x;
  di = v1->y;
  lim = 1.0;
  dVar3 = this->m_width_abs * mlimit;
  bVar1 = true;
  xi = dbevel;
  dbevel_local = mlimit;
  mlimit_local._4_4_ = lj;
  dStack_50 = dy2;
  dy2_local = dx2;
  dx2_local = dy1;
  dy1_local = dx1;
  dx1_local = (double)v2;
  v2_local = v1;
  v1_local = v0;
  v0_local = (vertex_dist *)vc;
  vc_local = (pod_bvector<agg::point_base<double>,_6U> *)this;
  bVar2 = calc_intersection(v0->x + dx1,v0->y - dy1,v1->x + dx1,v1->y - dy1,v1->x + dx2,v1->y - dy2,
                            v2->x + dx2,v2->y - dy2,&yi,&di);
  if (bVar2) {
    lim = calc_distance(v2_local->x,v2_local->y,yi,di);
    bVar2 = lim <= dVar3;
    if (bVar2) {
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,yi,di);
    }
    bVar1 = false;
  }
  else {
    dVar4 = v2_local->x + dy1_local;
    dVar5 = v2_local->y - dx2_local;
    dVar6 = cross_product(v1_local->x,v1_local->y,v2_local->x,v2_local->y,dVar4,dVar5);
    dVar4 = cross_product(v2_local->x,v2_local->y,*(double *)dx1_local,
                          *(double *)((long)dx1_local + 8),dVar4,dVar5);
    bVar2 = dVar6 < 0.0 == dVar4 < 0.0;
    if (bVar2) {
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1_local,
                 v2_local->y - dx2_local);
    }
  }
  x2._7_1_ = !bVar2;
  if (x2._7_1_) {
    if (mlimit_local._4_4_ == miter_join_revert) {
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1_local,
                 v2_local->y - dx2_local);
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy2_local,
                 v2_local->y - dStack_50);
    }
    else if (mlimit_local._4_4_ == miter_join_round) {
      calc_arc(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,v2_local->y,
               dy1_local,-dx2_local,dy2_local,-dStack_50);
    }
    else if (bVar1) {
      dbevel_local = (double)this->m_width_sign * dbevel_local;
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,
                 dx2_local * dbevel_local + v2_local->x + dy1_local,
                 dy1_local * dbevel_local + (v2_local->y - dx2_local));
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,
                 -dStack_50 * dbevel_local + v2_local->x + dy2_local,
                 -dy2_local * dbevel_local + (v2_local->y - dStack_50));
    }
    else {
      dVar4 = v2_local->x + dy1_local;
      dVar5 = v2_local->y - dx2_local;
      dVar6 = v2_local->x + dy2_local;
      dVar7 = v2_local->y - dStack_50;
      dVar3 = (dVar3 - xi) / (lim - xi);
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,
                 (yi - dVar4) * dVar3 + dVar4,(di - dVar5) * dVar3 + dVar5);
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,
                 (yi - dVar6) * dVar3 + dVar6,(di - dVar7) * dVar3 + dVar7);
    }
  }
  return;
}

Assistant:

void math_stroke<VC>::calc_miter(VC& vc,
                                     const vertex_dist& v0, 
                                     const vertex_dist& v1, 
                                     const vertex_dist& v2,
                                     double dx1, double dy1, 
                                     double dx2, double dy2,
                                     line_join_e lj,
                                     double mlimit,
                                     double dbevel)
    {
        double xi  = v1.x;
        double yi  = v1.y;
        double di  = 1;
        double lim = m_width_abs * mlimit;
        bool miter_limit_exceeded = true; // Assume the worst
        bool intersection_failed  = true; // Assume the worst

        if(calc_intersection(v0.x + dx1, v0.y - dy1,
                             v1.x + dx1, v1.y - dy1,
                             v1.x + dx2, v1.y - dy2,
                             v2.x + dx2, v2.y - dy2,
                             &xi, &yi))
        {
            // Calculation of the intersection succeeded
            //---------------------
            di = calc_distance(v1.x, v1.y, xi, yi);
            if(di <= lim)
            {
                // Inside the miter limit
                //---------------------
                add_vertex(vc, xi, yi);
                miter_limit_exceeded = false;
            }
            intersection_failed = false;
        }
        else
        {
            // Calculation of the intersection failed, most probably
            // the three points lie one straight line. 
            // First check if v0 and v2 lie on the opposite sides of vector: 
            // (v1.x, v1.y) -> (v1.x+dx1, v1.y-dy1), that is, the perpendicular
            // to the line determined by vertices v0 and v1.
            // This condition determines whether the next line segments continues
            // the previous one or goes back.
            //----------------
            double x2 = v1.x + dx1;
            double y2 = v1.y - dy1;
            if((cross_product(v0.x, v0.y, v1.x, v1.y, x2, y2) < 0.0) == 
               (cross_product(v1.x, v1.y, v2.x, v2.y, x2, y2) < 0.0))
            {
                // This case means that the next segment continues 
                // the previous one (straight line)
                //-----------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                miter_limit_exceeded = false;
            }
        }

        if(miter_limit_exceeded)
        {
            // Miter limit exceeded
            //------------------------
            switch(lj)
            {
            case miter_join_revert:
                // For the compatibility with SVG, PDF, etc, 
                // we use a simple bevel join instead of
                // "smart" bevel
                //-------------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case miter_join_round:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default:
                // If no miter-revert, calculate new dx1, dy1, dx2, dy2
                //----------------
                if(intersection_failed)
                {
                    mlimit *= m_width_sign;
                    add_vertex(vc, v1.x + dx1 + dy1 * mlimit, 
                                   v1.y - dy1 + dx1 * mlimit);
                    add_vertex(vc, v1.x + dx2 - dy2 * mlimit, 
                                   v1.y - dy2 - dx2 * mlimit);
                }
                else
                {
                    double x1 = v1.x + dx1;
                    double y1 = v1.y - dy1;
                    double x2 = v1.x + dx2;
                    double y2 = v1.y - dy2;
                    di = (lim - dbevel) / (di - dbevel);
                    add_vertex(vc, x1 + (xi - x1) * di, 
                                   y1 + (yi - y1) * di);
                    add_vertex(vc, x2 + (xi - x2) * di, 
                                   y2 + (yi - y2) * di);
                }
                break;
            }
        }
    }